

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alice.cpp
# Opt level: O2

long __thiscall
Alice::ObliviousTranslateSingleAddress
          (Alice *this,long addr,
          vector<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_> *Perm)

{
  long arg1;
  ulong uVar1;
  long lVar2;
  double dVar3;
  string local_70;
  double local_50;
  long local_48;
  vector<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_> *local_40;
  allocator local_31;
  
  local_50 = 0.0;
  lVar2 = 0;
  local_48 = addr;
  local_40 = Perm;
  for (uVar1 = 0;
      uVar1 < (ulong)((long)(local_40->
                            super__Vector_base<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>
                            )._M_impl.super__Vector_impl_data._M_finish -
                      (long)(local_40->
                            super__Vector_base<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>
                            )._M_impl.super__Vector_impl_data._M_start >> 4); uVar1 = uVar1 + 1) {
    std::__cxx11::string::string((string *)&local_70,"==",&local_31);
    arg1 = ObliviousComparison(this,&local_70,local_48,
                               *(long *)((long)&((local_40->
                                                 super__Vector_base<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>
                                                 )._M_impl.super__Vector_impl_data._M_start)->first
                                        + lVar2));
    std::__cxx11::string::~string((string *)&local_70);
    dVar3 = ObliviousMultiplication
                      (this,arg1,
                       *(long *)((long)&((local_40->
                                         super__Vector_base<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>
                                         )._M_impl.super__Vector_impl_data._M_start)->second + lVar2
                                ));
    local_50 = local_50 + dVar3;
    lVar2 = lVar2 + 0x10;
  }
  return (long)local_50;
}

Assistant:

long Alice::ObliviousTranslateSingleAddress(long addr, std::vector<std::pair<long,long>> Perm)
{
   double result = 0;
   long beta = 0;
   for(int i=0; i < Perm.size(); i++)
   {
       beta = ObliviousComparison("==", addr, Perm[i].first);
       result += ObliviousMultiplication(beta, Perm[i].second);
   } 
   return result;
}